

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O1

void __thiscall QGenericUnixThemePrivate::QGenericUnixThemePrivate(QGenericUnixThemePrivate *this)

{
  char16_t **ppcVar1;
  totally_ordered_wrapper<QFontPrivate_*> tVar2;
  int pointSize;
  QLoggingCategory *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  char *local_80;
  totally_ordered_wrapper<QFontPrivate_*> local_70;
  undefined1 local_68 [8];
  totally_ordered_wrapper<QFontPrivate_*> local_60;
  QFont local_58;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformThemePrivate::QPlatformThemePrivate(&this->super_QPlatformThemePrivate);
  (this->super_QPlatformThemePrivate)._vptr_QPlatformThemePrivate =
       (_func_int **)&PTR__QGenericUnixThemePrivate_007f4108;
  QVar4.m_data = (storage_type *)0xa;
  QVar4.m_size = (qsizetype)&local_98;
  QString::fromLatin1(QVar4);
  local_48.d.d = (Data *)CONCAT44(uStack_94,local_98);
  QFont::QFont(&this->systemFont,&local_48,9,-1,false);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)&local_98;
  QString::fromLatin1(QVar5);
  local_48.d.d = (Data *)CONCAT44(uStack_94,local_98);
  pointSize = QFont::pointSize(&this->systemFont);
  QFont::QFont(&this->fixedFont,&local_48,pointSize,-1,false);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFont::setStyleHint(&this->fixedFont,Courier,PreferDefault);
  pQVar3 = QtPrivateLogging::lcQpaFonts();
  if (((pQVar3->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_80 = pQVar3->name;
    local_98 = 2;
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    local_88 = 0;
    uStack_84 = 0;
    QMessageLogger::debug();
    tVar2.ptr = local_70.ptr;
    QVar6.m_data = (storage_type *)0x15;
    QVar6.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)tVar2.ptr,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)((local_70.ptr)->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)local_70.ptr,' ');
    }
    local_68 = (undefined1  [8])local_70.ptr;
    ppcVar1 = &((local_70.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((Stream *)&local_60,(QFont *)local_68);
    tVar2.ptr = local_60.ptr;
    QVar7.m_data = &DAT_00000005;
    QVar7.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<((QTextStream *)tVar2.ptr,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)((local_60.ptr)->request).styleName.d.size == '\x01') {
      QTextStream::operator<<((QTextStream *)local_60.ptr,' ');
    }
    local_58.d.d.ptr =
         (totally_ordered_wrapper<QFontPrivate_*>)
         (totally_ordered_wrapper<QFontPrivate_*>)local_60.ptr;
    ppcVar1 = &((local_60.ptr)->request).styleName.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((QDebug)&local_58.resolve_mask,&local_58);
    QDebug::~QDebug((QDebug *)&local_58.resolve_mask);
    QDebug::~QDebug((QDebug *)&local_58);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug((QDebug *)local_68);
    QDebug::~QDebug((QDebug *)&local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGenericUnixThemePrivate::QGenericUnixThemePrivate()
    : QPlatformThemePrivate()
    , systemFont(QLatin1StringView(QGenericUnixTheme::defaultSystemFontNameC),
                 QGenericUnixTheme::defaultSystemFontSize)
    , fixedFont(QLatin1StringView(QGenericUnixTheme::defaultFixedFontNameC),
                systemFont.pointSize())
{
    fixedFont.setStyleHint(QFont::TypeWriter);
    qCDebug(lcQpaFonts) << "default fonts: system" << systemFont << "fixed" << fixedFont;
}